

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O1

QString * __thiscall
QAccessibleWidget::text(QString *__return_storage_ptr__,QAccessibleWidget *this,Text t)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QArrayData *pQVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  long lVar6;
  QWindow *pQVar7;
  long *plVar8;
  long lVar9;
  long in_FS_OFFSET;
  QString local_50;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(t) {
  case Name:
    if ((this->d->name).d.size != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QString::operator=(__return_storage_ptr__,(QString *)&this->d->name);
        return __return_storage_ptr__;
      }
      goto LAB_00524f0d;
    }
    pQVar5 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    pQVar4 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
      pQVar4 = pQVar5;
    }
    QWidget::accessibleName(&local_38,pQVar4);
    qVar2 = local_38.d.size;
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (qVar2 == 0) {
      lVar6 = (**(code **)(*(long *)this + 0x18))(this);
      lVar9 = 0;
      if ((*(byte *)(*(long *)(lVar6 + 8) + 0x30) & 1) != 0) {
        lVar9 = lVar6;
      }
      if ((*(byte *)(*(long *)(lVar9 + 0x20) + 0xc) & 1) == 0) {
        pQVar4 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
        if (pQVar4 == (QWidget *)0x0) {
          pQVar5 = (QWidget *)0x0;
        }
        else {
          pQVar5 = (QWidget *)0x0;
          if ((*(byte *)(*(long *)&pQVar4->field_0x8 + 0x30) & 1) != 0) {
            pQVar5 = pQVar4;
          }
        }
        buddyString(&local_50,pQVar5);
        qt_accStripAmp(&local_38,&local_50);
        goto LAB_00524dd4;
      }
      pQVar5 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
      pQVar4 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
        pQVar4 = pQVar5;
      }
      pQVar7 = QWidget::windowHandle(pQVar4);
      if ((pQVar7 == (QWindow *)0x0) || (plVar8 = (long *)QWindow::handle(), plVar8 == (long *)0x0))
      goto switchD_00524bb8_caseD_2;
      (**(code **)(*plVar8 + 0x80))(&local_38,plVar8);
    }
    else {
      pQVar5 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
      pQVar4 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
        pQVar4 = pQVar5;
      }
      QWidget::accessibleName(&local_38,pQVar4);
    }
    break;
  case Description:
    pQVar5 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    pQVar4 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
      pQVar4 = pQVar5;
    }
    QWidget::accessibleDescription(&local_38,pQVar4);
    pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.d = (Data *)pQVar3;
    local_38.d.ptr = pcVar1;
    local_38.d.size = qVar2;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if ((__return_storage_ptr__->d).size == 0) {
      pQVar5 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
      pQVar4 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
        pQVar4 = pQVar5;
      }
      QWidget::toolTip(&local_38,pQVar4);
      break;
    }
  default:
    goto switchD_00524bb8_caseD_2;
  case Help:
    pQVar5 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    pQVar4 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
      pQVar4 = pQVar5;
    }
    QWidget::whatsThis(&local_38,pQVar4);
    break;
  case Accelerator:
    pQVar4 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    if (pQVar4 == (QWidget *)0x0) {
      pQVar5 = (QWidget *)0x0;
    }
    else {
      pQVar5 = (QWidget *)0x0;
      if ((*(byte *)(*(long *)&pQVar4->field_0x8 + 0x30) & 1) != 0) {
        pQVar5 = pQVar4;
      }
    }
    buddyString(&local_50,pQVar5);
    qt_accHotKey(&local_38,&local_50);
LAB_00524dd4:
    pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_38.d.d;
    (__return_storage_ptr__->d).ptr = local_38.d.ptr;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.d = (Data *)pQVar3;
    local_38.d.ptr = pcVar1;
    local_38.d.size = qVar2;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if (&(local_50.d.d)->super_QArrayData == (QArrayData *)0x0) goto switchD_00524bb8_caseD_2;
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
    goto switchD_00524bb8_caseD_2;
    goto LAB_00524e2b;
  case Identifier:
    pQVar5 = (QWidget *)(**(code **)(*(long *)this + 0x18))(this);
    pQVar4 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar5->field_0x8 + 0x30) & 1) != 0) {
      pQVar4 = pQVar5;
    }
    QWidget::accessibleIdentifier(&local_38,pQVar4);
  }
  local_50.d.d = (__return_storage_ptr__->d).d;
  pcVar1 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_38.d.d;
  (__return_storage_ptr__->d).ptr = local_38.d.ptr;
  qVar2 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_38.d.size;
  local_38.d.d = local_50.d.d;
  local_38.d.ptr = pcVar1;
  local_38.d.size = qVar2;
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
LAB_00524e2b:
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
switchD_00524bb8_caseD_2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_00524f0d:
  __stack_chk_fail();
}

Assistant:

QString QAccessibleWidget::text(QAccessible::Text t) const
{
    QString str;

    switch (t) {
    case QAccessible::Name:
        if (!d->name.isEmpty()) {
            str = d->name;
        } else if (!widget()->accessibleName().isEmpty()) {
            str = widget()->accessibleName();
        } else if (widget()->isWindow()) {
            if (QWindow *window = widget()->windowHandle()) {
                if (QPlatformWindow *platformWindow = window->handle())
                    str = platformWindow->windowTitle();
            }
        } else {
            str = qt_accStripAmp(buddyString(widget()));
        }
        break;
    case QAccessible::Description:
        str = widget()->accessibleDescription();
#if QT_CONFIG(tooltip)
        if (str.isEmpty())
            str = widget()->toolTip();
#endif
        break;
    case QAccessible::Identifier:
        str = widget()->accessibleIdentifier();
        break;
    case QAccessible::Help:
#if QT_CONFIG(whatsthis)
        str = widget()->whatsThis();
#endif
        break;
    case QAccessible::Accelerator:
        str = qt_accHotKey(buddyString(widget()));
        break;
    case QAccessible::Value:
        break;
    default:
        break;
    }
    return str;
}